

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * __thiscall
fmt::v10::detail::format_uint<4u,char,unsigned__int128>
          (detail *this,char *buffer,unsigned___int128 value,int num_digits,bool upper)

{
  undefined7 in_register_00000009;
  undefined4 in_register_00000014;
  byte in_R8B;
  char *local_60;
  uint digit;
  char *digits;
  char *end;
  uint uStack_38;
  bool upper_local;
  int num_digits_local;
  unsigned___int128 value_local;
  detail *local_20;
  char *buffer_local;
  
  value_local._0_8_ = CONCAT44(in_register_00000014,num_digits);
  _uStack_38 = buffer;
  local_20 = this + (int)CONCAT71(in_register_00000009,upper);
  do {
    if ((in_R8B & 1) == 0) {
      local_60 = "0123456789abcdef";
    }
    else {
      local_60 = "0123456789ABCDEF";
    }
    local_20[-1] = *(detail *)(local_60 + (uStack_38 & 0xf));
    _uStack_38 = (char *)((ulong)value_local << 0x3c | (ulong)_uStack_38 >> 4);
    value_local._0_8_ = (ulong)value_local >> 4;
    local_20 = local_20 + -1;
  } while (_uStack_38 != (char *)0x0 || (ulong)value_local != 0);
  return (char *)(this + (int)CONCAT71(in_register_00000009,upper));
}

Assistant:

FMT_CONSTEXPR auto format_uint(Char* buffer, UInt value, int num_digits,
                               bool upper = false) -> Char* {
  buffer += num_digits;
  Char* end = buffer;
  do {
    const char* digits = upper ? "0123456789ABCDEF" : "0123456789abcdef";
    unsigned digit = static_cast<unsigned>(value & ((1 << BASE_BITS) - 1));
    *--buffer = static_cast<Char>(BASE_BITS < 4 ? static_cast<char>('0' + digit)
                                                : digits[digit]);
  } while ((value >>= BASE_BITS) != 0);
  return end;
}